

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_ManFree(Au_Man_t *p)

{
  int iVar1;
  Au_Man_t *p_local;
  
  if (p->nRefs < 1) {
    __assert_fail("p->nRefs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                  ,0x152,"void Au_ManFree(Au_Man_t *)");
  }
  iVar1 = p->nRefs + -1;
  p->nRefs = iVar1;
  if (iVar1 < 1) {
    if (p->pFuncs != (Abc_Nam_t *)0x0) {
      Abc_NamStop(p->pFuncs);
    }
    if ((p->vNtks).pArray != (void **)0x0) {
      free((p->vNtks).pArray);
      (p->vNtks).pArray = (void **)0x0;
    }
    if (p->pName != (char *)0x0) {
      free(p->pName);
      p->pName = (char *)0x0;
    }
    if (p != (Au_Man_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Au_ManFree( Au_Man_t * p )
{
    assert( p->nRefs > 0 );
    if ( --p->nRefs > 0 )
        return;
    if ( p->pFuncs )
        Abc_NamStop( p->pFuncs );
    ABC_FREE( p->vNtks.pArray );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}